

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

Bool prvTidyParseConfigOption(TidyDocImpl *doc,ctmbstr optnam,ctmbstr optval)

{
  int iVar1;
  Bool BVar2;
  TidyConfigCallback p_Var3;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffc8;
  do {
    iVar1 = prvTidytmbstrcasecmp(optnam,*(ctmbstr *)((long)&option_defs[1].name + uVar4));
    if (iVar1 == 0) {
      BVar2 = prvTidyParseConfigValue
                        (doc,*(TidyOptionId *)((long)&option_defs[1].id + uVar4),optval);
      return BVar2;
    }
    uVar4 = uVar4 + 0x38;
  } while (uVar4 < 0x1688);
  if (doc->pOptCallback == (TidyOptCallback)0x0) {
    p_Var3 = doc->pConfigCallback;
    if (p_Var3 == (TidyConfigCallback)0x0) goto LAB_00155093;
LAB_00155076:
    BVar2 = (*p_Var3)((TidyDoc)doc,optnam,optval);
    BVar2 = (Bool)(BVar2 != no);
  }
  else {
    BVar2 = (*doc->pOptCallback)(optnam,optval);
    p_Var3 = doc->pConfigCallback;
    if (p_Var3 != (TidyConfigCallback)0x0) {
      if (BVar2 != no) {
        return yes;
      }
      goto LAB_00155076;
    }
  }
  if (BVar2 != no) {
    return BVar2;
  }
LAB_00155093:
  prvTidyReportUnknownOption(doc,optnam);
  return no;
}

Assistant:

Bool TY_(ParseConfigOption)( TidyDocImpl* doc, ctmbstr optnam, ctmbstr optval )
{
    const TidyOptionImpl* option = TY_(lookupOption)( optnam );
    Bool isDeprecated = isOptionDeprecated( optnam );
    Bool status = ( option != NULL ) && !isDeprecated;
    if ( !status )
    {
        /* Unknown or deprecated, so check to see if the user application
           wants to deal with it first. */
        if (NULL != doc->pOptCallback)
            status = (*doc->pOptCallback)( optnam, optval );
        if (NULL != doc->pConfigCallback )
            status = status || (*doc->pConfigCallback)( tidyImplToDoc(doc), optnam, optval );
        if (!status && isDeprecated)
            status = subDeprecatedOption( doc, optnam, optval);
        if (!status)
            TY_(ReportUnknownOption)( doc, optnam );
    }
    else
        status = TY_(ParseConfigValue)( doc, option->id, optval );

    return status;
}